

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O2

void __thiscall Bipartition::complement(Bipartition *this,size_t numLeaves)

{
  size_type pos;
  bool bVar1;
  reference rVar2;
  
  pos = (this->partition).m_num_bits;
  while( true ) {
    pos = pos - 1;
    bVar1 = numLeaves == 0;
    numLeaves = numLeaves - 1;
    if (bVar1) break;
    rVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&this->partition,pos);
    *rVar2.m_block = *rVar2.m_block ^ rVar2.m_mask;
  }
  return;
}

Assistant:

void Bipartition::complement(size_t numLeaves) {
    size_t s = size();
    for (size_t i = 0; i < numLeaves; ++i) {
        partition[s - i - 1].flip();
    }
}